

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_write(Curl_easy *data)

{
  smb_request *psVar1;
  curl_off_t cVar2;
  smb_header *h;
  CURLcode CVar3;
  size_t local_40;
  curl_off_t upload_size;
  curl_off_t offset;
  smb_request *req;
  smb_write *msg;
  smb_conn *smbc;
  connectdata *conn;
  Curl_easy *data_local;
  
  psVar1 = (data->req).p.smb;
  cVar2 = (data->req).offset;
  local_40 = (data->req).size - (data->req).bytecount;
  h = (smb_header *)(data->conn->proto).ftpc.pp.response_time;
  if (0x7ffe < (long)local_40) {
    local_40 = 0x7fff;
  }
  memset(h,0,0x44);
  h[1].nbt_type = '\x0e';
  h[1].nbt_flags = 0xff;
  *(unsigned_short *)(h[1].magic + 1) = psVar1->fid;
  *(int *)(h[1].magic + 3) = (int)cVar2;
  *(int *)(h[1].signature + 7) = (int)((ulong)cVar2 >> 0x20);
  *(short *)(h[1].signature + 3) = (short)local_40;
  h[1].signature[5] = '@';
  h[1].signature[6] = '\0';
  *(short *)((long)&h[1].tid + 1) = (short)local_40 + 1;
  smb_format_message(data,h,'/',local_40 + 0x20);
  CVar3 = smb_send(data,0x44,local_40);
  return CVar3;
}

Assistant:

static CURLcode smb_send_write(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_write *msg;
  struct smb_request *req = data->req.p.smb;
  curl_off_t offset = data->req.offset;
  curl_off_t upload_size = data->req.size - data->req.bytecount;

  msg = (struct smb_write *)smbc->send_buf;
  if(upload_size >= MAX_PAYLOAD_SIZE - 1) /* There is one byte of padding */
    upload_size = MAX_PAYLOAD_SIZE - 1;

  memset(msg, 0, sizeof(*msg));
  msg->word_count = SMB_WC_WRITE_ANDX;
  msg->andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg->fid = smb_swap16(req->fid);
  msg->offset = smb_swap32((unsigned int) offset);
  msg->offset_high = smb_swap32((unsigned int) (offset >> 32));
  msg->data_length = smb_swap16((unsigned short) upload_size);
  msg->data_offset = smb_swap16(sizeof(*msg) - sizeof(unsigned int));
  msg->byte_count = smb_swap16((unsigned short) (upload_size + 1));

  smb_format_message(data, &msg->h, SMB_COM_WRITE_ANDX,
                     sizeof(*msg) - sizeof(msg->h) + (size_t) upload_size);

  return smb_send(data, sizeof(*msg), (size_t) upload_size);
}